

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

void bcf_set_variant_types(bcf1_t *b)

{
  char *pcVar1;
  char **ppcVar2;
  char *pcVar3;
  variant_t *pvVar4;
  char cVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  
  if ((b->unpacked & 1) == 0) {
    bcf_unpack(b,1);
  }
  uVar6 = *(ulong *)&b->field_0x10;
  uVar7 = (uint)(uVar6 >> 0x10) & 0xffff;
  if ((b->d).n_var < (int)uVar7) {
    pvVar4 = (variant_t *)realloc((b->d).var,(ulong)(uVar7 << 3));
    (b->d).var = pvVar4;
    uVar6 = *(ulong *)&b->field_0x10;
    (b->d).n_var = (uint)(uVar6 >> 0x10) & 0xffff;
  }
  (b->d).var_type = 0;
  if ((uVar6 & 0xfffe0000) != 0) {
    ppcVar2 = (b->d).allele;
    pvVar4 = (b->d).var;
    pcVar3 = *ppcVar2;
    pcVar1 = pcVar3 + 1;
    uVar6 = 1;
    uVar7 = 0;
    do {
      pcVar9 = ppcVar2[uVar6];
      if ((*pcVar1 == '\0') && (pcVar9[1] == '\0')) {
        cVar5 = *pcVar9;
        if (((cVar5 == '.') || (*pcVar3 == cVar5)) || (cVar5 == 'X')) {
LAB_0012374f:
          pvVar4[uVar6].type = 0;
          pvVar4[uVar6].n = 0;
          uVar8 = 0;
        }
        else {
LAB_001237c4:
          pvVar4[uVar6].type = 1;
          pvVar4[uVar6].n = 1;
          uVar8 = 1;
        }
      }
      else {
        cVar5 = *pcVar9;
        if (cVar5 == '<') {
          if ((pcVar9[1] != 'X') || (pcVar9[2] != '>')) goto LAB_00123620;
          goto LAB_0012374f;
        }
        iVar13 = (int)pcVar9;
        pcVar14 = pcVar3;
        if (*pcVar3 == '\0') {
LAB_00123713:
          if (cVar5 == '\0') goto LAB_0012374f;
          iVar13 = ~((int)pcVar14 + iVar13) + (int)pcVar1 + (int)pcVar9;
          do {
            pcVar9 = pcVar9 + 1;
            iVar13 = iVar13 + 1;
          } while (*pcVar9 != '\0');
          pvVar4[uVar6].n = iVar13;
        }
        else {
          pcVar17 = pcVar1;
          if (*pcVar3 == cVar5) {
            do {
              pcVar14 = pcVar17;
              pcVar9 = pcVar9 + 1;
              cVar5 = *pcVar9;
              if (*pcVar14 == '\0') goto LAB_00123713;
              pcVar17 = pcVar14 + 1;
            } while (*pcVar14 == cVar5);
          }
          if (cVar5 == '\0') {
            lVar12 = 0;
            do {
              pcVar17 = pcVar14 + lVar12;
              lVar12 = lVar12 + 1;
            } while (*pcVar17 != '\0');
            pvVar4[uVar6].n =
                 ((((int)pcVar9 + (int)pcVar3) - ((int)pcVar14 + iVar13)) - (int)lVar12) + 1;
          }
          else {
            pcVar17 = pcVar14 + -1;
            do {
              pcVar16 = pcVar17;
              pcVar17 = pcVar16 + 1;
            } while (pcVar16[2] != '\0');
            pcVar11 = pcVar9 + -1;
            do {
              pcVar10 = pcVar11;
              pcVar11 = pcVar10 + 1;
            } while (pcVar10[2] != '\0');
            if (((pcVar9 < pcVar11) && (pcVar14 < pcVar17)) && (*pcVar17 == *pcVar11)) {
              do {
                pcVar17 = pcVar16;
                pcVar11 = pcVar10;
                if ((pcVar11 <= pcVar9) || (pcVar17 <= pcVar14)) break;
                pcVar10 = pcVar11 + -1;
                pcVar16 = pcVar17 + -1;
              } while (*pcVar17 == *pcVar11);
            }
            lVar12 = (long)pcVar11 - (long)pcVar9;
            if (lVar12 == 0) {
              if (pcVar17 == pcVar14) goto LAB_001237c4;
              pvVar4[uVar6].n = (int)pcVar14 - (int)pcVar17;
              if (*pcVar17 != *pcVar9) goto LAB_00123620;
            }
            else {
              lVar18 = (long)pcVar17 - (long)pcVar14;
              if (lVar18 != 0) {
                uVar8 = 8;
                if (lVar18 == lVar12) {
                  uVar8 = 2;
                }
                pvVar4[uVar6].type = uVar8;
                uVar15 = ~(uint)lVar18;
                if (lVar18 <= lVar12) {
                  uVar15 = (int)lVar12 + 1;
                }
                pvVar4[uVar6].n = uVar15;
                goto LAB_0012378c;
              }
              pvVar4[uVar6].n = (int)pcVar11 - (int)pcVar9;
              if (*pcVar14 != *pcVar11) {
LAB_00123620:
                pvVar4[uVar6].type = 8;
                uVar8 = 8;
                goto LAB_0012378c;
              }
            }
          }
        }
        pvVar4[uVar6].type = 4;
        uVar8 = 4;
      }
LAB_0012378c:
      uVar7 = uVar7 | uVar8;
      (b->d).var_type = uVar7;
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(ushort *)&b->field_0x12);
  }
  return;
}

Assistant:

static void bcf_set_variant_types(bcf1_t *b)
{
    if ( !(b->unpacked & BCF_UN_STR) ) bcf_unpack(b, BCF_UN_STR);
    bcf_dec_t *d = &b->d;
    if ( d->n_var < b->n_allele )
    {
        d->var = (variant_t *) realloc(d->var, sizeof(variant_t)*b->n_allele);
        d->n_var = b->n_allele;
    }
    int i;
    b->d.var_type = 0;
    for (i=1; i<b->n_allele; i++)
    {
        bcf_set_variant_type(d->allele[0],d->allele[i], &d->var[i]);
        b->d.var_type |= d->var[i].type;
        //fprintf(stderr,"[set_variant_type] %d   %s %s -> %d %d .. %d\n", b->pos+1,d->allele[0],d->allele[i],d->var[i].type,d->var[i].n, b->d.var_type);
    }
}